

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int print_automorphism_ntk
              (FILE *f,int n,int *gamma,int nsupp,int *support,char *marks,Abc_Ntk_t *pNtk)

{
  int v;
  char *pcVar1;
  int local_40;
  int k;
  int j;
  int i;
  char *marks_local;
  int *support_local;
  int nsupp_local;
  int *gamma_local;
  int n_local;
  FILE *f_local;
  
  for (k = 0; k < nsupp; k = k + 1) {
    v = support[k];
    if (marks[v] == '\0') {
      marks[v] = '\x01';
      pcVar1 = getVertexName(pNtk,v);
      fprintf((FILE *)f,"(%s",pcVar1);
      for (local_40 = gamma[v]; local_40 != v; local_40 = gamma[local_40]) {
        marks[local_40] = '\x01';
        pcVar1 = getVertexName(pNtk,local_40);
        fprintf((FILE *)f," %s",pcVar1);
      }
      fprintf((FILE *)f,")");
    }
  }
  fprintf((FILE *)f,"\n");
  for (k = 0; k < nsupp; k = k + 1) {
    marks[support[k]] = '\0';
  }
  return 1;
}

Assistant:

static int
print_automorphism_ntk(FILE *f, int n, const int *gamma, int nsupp, const int *support, char * marks, Abc_Ntk_t * pNtk)
{
    int i, j, k;    

    /* We presume support is already sorted */
    for (i = 0; i < nsupp; ++i) {
        k = support[i];

        /* Skip elements already seen */
        if (marks[k]) continue;

        /* Start an orbit */
        marks[k] = 1;
        fprintf(f, "(%s", getVertexName(pNtk, k));

        /* Mark and notify elements in this orbit */
        for (j = gamma[k]; j != k; j = gamma[j]) {
            marks[j] = 1;
            fprintf(f, " %s", getVertexName(pNtk, j));
        }

        /* Finish off the orbit */
        fprintf(f, ")");
    }
    fprintf(f, "\n");

    /* Clean up after ourselves */
    for (i = 0; i < nsupp; ++i) {
        marks[support[i]] = 0;
    }

    return 1;
}